

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O1

Memory * __thiscall wabt::Module::GetMemory(Module *this,Var *var)

{
  Index IVar1;
  Memory *pMVar2;
  
  IVar1 = BindingHash::FindIndex(&this->memory_bindings,var);
  if ((ulong)IVar1 < (ulong)(*(long *)&this->field_0x138 - *(long *)&this->memories >> 3)) {
    pMVar2 = *(Memory **)(*(long *)&this->memories + (ulong)IVar1 * 8);
  }
  else {
    pMVar2 = (Memory *)0x0;
  }
  return pMVar2;
}

Assistant:

const Memory* Module::GetMemory(const Var& var) const {
  return const_cast<Module*>(this)->GetMemory(var);
}